

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::HashAggregateDistinctFinalizeTask::HashAggregateDistinctFinalizeTask
          (HashAggregateDistinctFinalizeTask *this,Pipeline *pipeline,
          shared_ptr<duckdb::Event,_true> *event_p,PhysicalHashAggregate *op,
          HashAggregateGlobalSinkState *state_p)

{
  Executor *executor_p;
  shared_ptr<duckdb::Event,_true> local_38;
  
  executor_p = pipeline->executor;
  local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ExecutorTask::ExecutorTask(&this->super_ExecutorTask,executor_p,&local_38);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->super_ExecutorTask).super_Task._vptr_Task =
       (_func_int **)&PTR__HashAggregateDistinctFinalizeTask_0179d8e8;
  this->pipeline = pipeline;
  this->op = op;
  this->gstate = state_p;
  (this->local_sink_state).
  super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
  super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = (LocalSinkState *)0x0;
  this->grouping_idx = 0;
  *(undefined8 *)((long)&this->grouping_idx + 1) = 0;
  *(undefined8 *)
   ((long)&(this->radix_table_lstate).
           super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
           .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false> + 1) = 0;
  this->aggregation_idx = 0;
  this->payload_idx = 0;
  this->next_payload_idx = 0;
  return;
}

Assistant:

HashAggregateDistinctFinalizeTask(Pipeline &pipeline, shared_ptr<Event> event_p, const PhysicalHashAggregate &op,
	                                  HashAggregateGlobalSinkState &state_p)
	    : ExecutorTask(pipeline.executor, std::move(event_p)), pipeline(pipeline), op(op), gstate(state_p) {
	}